

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O0

bool __thiscall wavingz::demod::state_machine::sample_sm_t::idle(sample_sm_t *this)

{
  bool bVar1;
  pointer psVar2;
  sample_sm_t *this_local;
  
  psVar2 = std::
           unique_ptr<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
           ::get(&this->current_state_m);
  if (psVar2 == (pointer)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)psVar2->_vptr_state_base_t[-1],
                     (type_info *)&sample_sm::idle_t::typeinfo);
  return bVar1;
}

Assistant:

bool idle() { return typeid(*current_state_m.get()) == typeid(sample_sm::idle_t); }